

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_vertical_4_quad_sse2
               (uint8_t *s,int pitch,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0)

{
  uchar *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  uchar *in_RDI;
  undefined8 in_R8;
  uchar t_dst [128];
  int in_stack_000000d4;
  uchar *in_stack_000000d8;
  int in_stack_000000e4;
  uchar *in_stack_000000e8;
  uchar *in_stack_00000178;
  uchar *in_stack_00000180;
  uchar *in_stack_00000188;
  int in_stack_00000194;
  uchar *in_stack_00000198;
  undefined4 in_stack_fffffffffffffff0;
  
  transpose_16x8(in_RDI,(uchar *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 (int)((ulong)in_RDX >> 0x20),in_RCX,(int)((ulong)in_R8 >> 0x20));
  aom_lpf_horizontal_4_quad_sse2
            (in_stack_00000198,in_stack_00000194,in_stack_00000188,in_stack_00000180,
             in_stack_00000178);
  transpose_16x8_to_8x16(in_stack_000000e8,in_stack_000000e4,in_stack_000000d8,in_stack_000000d4);
  return;
}

Assistant:

void aom_lpf_vertical_4_quad_sse2(uint8_t *s, int pitch,
                                  const uint8_t *_blimit0,
                                  const uint8_t *_limit0,
                                  const uint8_t *_thresh0) {
  DECLARE_ALIGNED(16, unsigned char, t_dst[16 * 8]);

  // Transpose 16x8
  transpose_16x8(s - 4, s - 4 + pitch * 8, pitch, t_dst, 16);

  // Loop filtering
  aom_lpf_horizontal_4_quad_sse2(t_dst + 4 * 16, 16, _blimit0, _limit0,
                                 _thresh0);

  // Transpose back
  transpose_16x8_to_8x16(t_dst, 16, s - 4, pitch);
}